

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O0

void DwaCompressor_destroy(DwaCompressor *me)

{
  long in_RDI;
  int i_1;
  size_t i;
  int c;
  DctCoderChannelData *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar1;
  ulong local_18;
  int local_c;
  
  if (*(long *)(in_RDI + 0x58) != 0) {
    (**(code **)(in_RDI + 0xc0))(*(undefined8 *)(in_RDI + 0x58));
  }
  if (*(long *)(in_RDI + 0x68) != 0) {
    (**(code **)(in_RDI + 0xc0))(*(undefined8 *)(in_RDI + 0x68));
  }
  if (*(long *)(in_RDI + 0x78) != 0) {
    (**(code **)(in_RDI + 0xc0))(*(undefined8 *)(in_RDI + 0x78));
  }
  if (*(long *)(in_RDI + 0x40) != 0) {
    for (local_c = 0; local_c < *(int *)(in_RDI + 0x28); local_c = local_c + 1) {
      DctCoderChannelData_destroy
                ((_func_void_void_ptr *)
                 CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffd8);
    }
    (**(code **)(in_RDI + 0xc0))(*(undefined8 *)(in_RDI + 0x40));
  }
  if (*(long *)(in_RDI + 0x38) != 0) {
    (**(code **)(in_RDI + 0xc0))(*(undefined8 *)(in_RDI + 0x38));
  }
  if ((*(Classifier **)(in_RDI + 0x48) != sLegacyChannelRules) &&
     (*(Classifier **)(in_RDI + 0x48) != sDefaultChannelRules)) {
    for (local_18 = 0; local_18 < *(ulong *)(in_RDI + 0x50); local_18 = local_18 + 1) {
      Classifier_destroy((_func_void_void_ptr *)
                         CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                         (Classifier *)in_stack_ffffffffffffffd8);
    }
    (**(code **)(in_RDI + 0xc0))(*(undefined8 *)(in_RDI + 0x48));
  }
  for (iVar1 = 0; iVar1 < 3; iVar1 = iVar1 + 1) {
    if (*(long *)(in_RDI + 0x88 + (long)iVar1 * 8) != 0) {
      (**(code **)(in_RDI + 0xc0))(*(undefined8 *)(in_RDI + 0x88 + (long)iVar1 * 8));
    }
  }
  return;
}

Assistant:

static void
DwaCompressor_destroy (DwaCompressor* me)
{
    if (me->_packedAcBuffer) me->free_fn (me->_packedAcBuffer);
    if (me->_packedDcBuffer) me->free_fn (me->_packedDcBuffer);
    if (me->_rleBuffer) me->free_fn (me->_rleBuffer);

    if (me->_channel_mem)
    {
        for (int c = 0; c < me->_numChannels; ++c)
            DctCoderChannelData_destroy (
                me->free_fn, &(me->_channelData[c]._dctData));

        me->free_fn (me->_channel_mem);
    }

    if (me->_cscChannelSets) me->free_fn (me->_cscChannelSets);
    if (me->_channelRules != sLegacyChannelRules &&
        me->_channelRules != sDefaultChannelRules)
    {
        for (size_t i = 0; i < me->_channelRuleCount; ++i)
            Classifier_destroy (me->free_fn, &(me->_channelRules[i]));
        me->free_fn (me->_channelRules);
    }

    for (int i = 0; i < NUM_COMPRESSOR_SCHEMES; ++i)
    {
        if (me->_planarUncBuffer[i]) me->free_fn (me->_planarUncBuffer[i]);
    }
}